

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_converter.hpp
# Opt level: O0

string * __thiscall
trial::protocol::json::detail::string_converter<char,long_double>::encode_abi_cxx11_
          (string *__return_storage_ptr__,string_converter<char,long_double> *this,longdouble value)

{
  ostream *poVar1;
  allocator<char> local_1e9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  string local_1d8 [8];
  string work;
  locale local_1a8 [8];
  ostringstream local_1a0 [8];
  ostringstream stream;
  longdouble value_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::locale::classic();
  std::ios::imbue(local_1a8);
  std::locale::~locale(local_1a8);
  poVar1 = (ostream *)std::ostream::operator<<(local_1a0,std::showpoint);
  work.field_2._8_4_ = std::setprecision(0x12);
  poVar1 = std::operator<<(poVar1,(_Setprecision)work.field_2._8_4_);
  std::ostream::operator<<(poVar1,value);
  std::__cxx11::ostringstream::str();
  local_1e0._M_current = (char *)std::__cxx11::string::begin();
  local_1e8._M_current = (char *)std::__cxx11::string::end();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
            ((string *)__return_storage_ptr__,local_1e0,local_1e8,&local_1e9);
  std::allocator<char>::~allocator(&local_1e9);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static string encode(long double value)
    {
        // Workaround for CharT = unsigned char, which std::locale does not support
        std::ostringstream stream;
        stream.imbue(std::locale::classic());
        stream << std::showpoint << std::setprecision(std::numeric_limits<long double>::digits10) << value;
        std::string work = stream.str();
        return {work.begin(), work.end()};
    }